

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.cpp
# Opt level: O2

ostream * deqp::ub::operator<<(ostream *str,LayoutFlagsFmt *fmt)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  
  uVar2 = fmt->flags;
  for (lVar3 = 8; lVar3 != 0x58; lVar3 = lVar3 + 0x10) {
    uVar1 = *(uint *)(&UNK_01e07c98 + lVar3);
    if ((uVar1 & uVar2) != 0) {
      if (uVar2 != fmt->flags) {
        std::operator<<(str,", ");
      }
      std::operator<<(str,*(char **)((long)&operator<<::bitDesc[0].bit + lVar3));
      uVar2 = uVar2 & ~uVar1;
    }
  }
  return str;
}

Assistant:

std::ostream& operator<<(std::ostream& str, const LayoutFlagsFmt& fmt)
{
	static const struct
	{
		deUint32	bit;
		const char* token;
	} bitDesc[] = { { LAYOUT_SHARED, "shared" },
					{ LAYOUT_PACKED, "packed" },
					{ LAYOUT_STD140, "std140" },
					{ LAYOUT_ROW_MAJOR, "row_major" },
					{ LAYOUT_COLUMN_MAJOR, "column_major" } };

	deUint32 remBits = fmt.flags;
	for (int descNdx = 0; descNdx < DE_LENGTH_OF_ARRAY(bitDesc); descNdx++)
	{
		if (remBits & bitDesc[descNdx].bit)
		{
			if (remBits != fmt.flags)
				str << ", ";
			str << bitDesc[descNdx].token;
			remBits &= ~bitDesc[descNdx].bit;
		}
	}
	DE_ASSERT(remBits == 0);
	return str;
}